

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-oid.c
# Opt level: O0

void test_bson_oid_init_with_threads(void)

{
  pthread_t pVar1;
  void *__arg;
  pthread_t threads_1 [4];
  pthread_t threads [4];
  bson_context_t *contexts [4];
  bson_context_flags_t flags;
  int i;
  bson_context_t *context;
  
  for (contexts[3]._4_4_ = 0; contexts[3]._4_4_ < 4; contexts[3]._4_4_ = contexts[3]._4_4_ + 1) {
    pVar1 = bson_context_new(8);
    threads[(long)contexts[3]._4_4_ + 3] = pVar1;
    pthread_create(threads_1 + (long)contexts[3]._4_4_ + 3,(pthread_attr_t *)0x0,oid_worker,
                   (void *)threads[(long)contexts[3]._4_4_ + 3]);
  }
  for (contexts[3]._4_4_ = 0; contexts[3]._4_4_ < 4; contexts[3]._4_4_ = contexts[3]._4_4_ + 1) {
    pthread_join(threads_1[(long)contexts[3]._4_4_ + 3],(void **)0x0);
  }
  for (contexts[3]._4_4_ = 0; contexts[3]._4_4_ < 4; contexts[3]._4_4_ = contexts[3]._4_4_ + 1) {
    bson_context_destroy(threads[(long)contexts[3]._4_4_ + 3]);
  }
  __arg = (void *)bson_context_new(1);
  for (contexts[3]._4_4_ = 0; contexts[3]._4_4_ < 4; contexts[3]._4_4_ = contexts[3]._4_4_ + 1) {
    pthread_create(threads_1 + (long)contexts[3]._4_4_ + -1,(pthread_attr_t *)0x0,oid_worker,__arg);
  }
  for (contexts[3]._4_4_ = 0; contexts[3]._4_4_ < 4; contexts[3]._4_4_ = contexts[3]._4_4_ + 1) {
    pthread_join(threads_1[(long)contexts[3]._4_4_ + -1],(void **)0x0);
  }
  bson_context_destroy(__arg);
  return;
}

Assistant:

static void
test_bson_oid_init_with_threads (void)
{
   bson_context_t *context;
   int i;

   {
      bson_context_flags_t flags = BSON_CONTEXT_NONE;
      bson_context_t *contexts[N_THREADS];
      bson_thread_t threads[N_THREADS];

#ifdef BSON_HAVE_SYSCALL_TID
      flags |= BSON_CONTEXT_USE_TASK_ID;
#endif

      for (i = 0; i < N_THREADS; i++) {
         contexts[i] = bson_context_new (flags);
         bson_thread_create (&threads[i], oid_worker, contexts[i]);
      }

      for (i = 0; i < N_THREADS; i++) {
         bson_thread_join (threads[i]);
      }

      for (i = 0; i < N_THREADS; i++) {
         bson_context_destroy (contexts[i]);
      }
   }

   /*
    * Test threaded generation of oids using a single context;
    */
   {
      bson_thread_t threads[N_THREADS];

      context = bson_context_new (BSON_CONTEXT_THREAD_SAFE);

      for (i = 0; i < N_THREADS; i++) {
         bson_thread_create (&threads[i], oid_worker, context);
      }

      for (i = 0; i < N_THREADS; i++) {
         bson_thread_join (threads[i]);
      }

      bson_context_destroy (context);
   }
}